

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# layout.cpp
# Opt level: O1

int __thiscall mpt::layout::bind(layout *this,int __fd,sockaddr *__addr,socklen_t __len)

{
  convertable *this_00;
  content<mpt::item<mpt::metatype>_> *pcVar1;
  content<mpt::item<mpt::layout::graph>_> *pcVar2;
  object *from;
  bool bVar3;
  int iVar4;
  int iVar5;
  undefined4 extraout_var;
  graph *this_01;
  char *id;
  undefined4 extraout_var_00;
  graph *from_00;
  item<mpt::layout::graph> *piVar6;
  undefined4 extraout_var_01;
  long lVar7;
  content<mpt::item<mpt::metatype>_> *pcVar8;
  content<mpt::item<mpt::metatype>_> *pcVar9;
  undefined4 in_register_00000034;
  content<mpt::item<mpt::metatype>_> *pcVar10;
  unique_array<mpt::item<mpt::layout::graph>_> uVar11;
  item_array<mpt::layout::graph> arr;
  relation me;
  unique_array<mpt::item<mpt::layout::graph>_> local_60;
  content<mpt::item<mpt::metatype>_> *local_58;
  object *local_50;
  undefined8 local_48;
  group *local_40;
  undefined1 local_38;
  
  pcVar9 = (this->super_item_group)._items.super_unique_array<mpt::item<mpt::metatype>_>._ref._ref;
  if (pcVar9 == (content<mpt::item<mpt::metatype>_> *)0x0) {
    pcVar9 = (content<mpt::item<mpt::metatype>_> *)0x0;
  }
  else {
    iVar4 = (*(pcVar9->super_buffer)._vptr_buffer[2])(pcVar9);
    if (CONCAT44(extraout_var,iVar4) == 0) {
      pcVar9 = (content<mpt::item<mpt::metatype>_> *)0x0;
    }
  }
  if (CONCAT44(in_register_00000034,__fd) == 0) {
    local_40 = &(this->super_item_group).super_group;
    local_50 = (object *)&PTR_find_0014a058;
    local_48 = 0;
    local_38 = 0x2e;
    iVar4 = item_group::bind(&this->super_item_group,(int)&local_50,__addr,0x14a058);
  }
  else {
    iVar4 = item_group::bind(&this->super_item_group,__fd,__addr,__len);
  }
  if (-1 < iVar4) {
    unique_array<mpt::item<mpt::layout::graph>_>::unique_array(&local_60,-1);
    pcVar8 = (this->super_item_group)._items.super_unique_array<mpt::item<mpt::metatype>_>._ref._ref
    ;
    pcVar10 = pcVar8 + 1;
    if (pcVar8 == (content<mpt::item<mpt::metatype>_> *)0x0) {
      pcVar8 = (content<mpt::item<mpt::metatype>_> *)0x0;
      pcVar10 = (content<mpt::item<mpt::metatype>_> *)0x0;
    }
    else {
      pcVar8 = (content<mpt::item<mpt::metatype>_> *)
               ((long)&(pcVar10->super_buffer)._vptr_buffer +
               ((pcVar8->super_buffer)._used & 0xffffffffffffffe0));
    }
    if (pcVar10 != pcVar8) {
      do {
        local_58 = pcVar8;
        this_00 = (convertable *)(pcVar10->super_buffer)._vptr_buffer;
        iVar4 = 3;
        if ((this_00 != (convertable *)0x0) &&
           (this_01 = convertable::operator_cast_to_graph_(this_00), this_01 != (graph *)0x0)) {
          id = identifier::name((identifier *)&(pcVar10->super_buffer)._content_traits);
          iVar4 = (*(this_01->super_item_group).super_metatype.super_convertable._vptr_convertable
                    [2])(this_01);
          if (CONCAT44(extraout_var_00,iVar4) == 0) {
            from_00 = convertable::operator_cast_to_graph_(this_00);
            if (from_00 == (graph *)0x0) {
LAB_00137855:
              iVar4 = 3;
              if (__addr == (sockaddr *)0x0) {
LAB_00137911:
                iVar4 = 3;
                bVar3 = false;
              }
              else if ((id == (char *)0x0) || (*id == '\0')) {
                bVar3 = false;
                logger::message((logger *)__addr,"mpt::layout::bind",4,"%s",
                                "unable to get graph information");
              }
              else {
                bVar3 = false;
                logger::message((logger *)__addr,"mpt::layout::bind",4,"%s: %s",
                                "unable to get graph information",id);
              }
            }
            else {
              local_50 = (object *)0x0;
              iVar4 = (**this_00->_vptr_convertable)(this_00,0x84,&local_50);
              from = local_50;
              if (local_50 == (object *)0x0 || iVar4 < 0) goto LAB_00137855;
              this_01 = (graph *)operator_new(0x68);
              graph::graph(this_01,from_00);
              bVar3 = object::set(&this_01->super_object,from,(logger *)__addr);
              if (!bVar3) {
                (*(this_01->super_item_group).super_metatype.super_convertable._vptr_convertable[1])
                          (this_01);
                goto LAB_00137911;
              }
              iVar4 = 0;
              bVar3 = true;
            }
            if (!bVar3) goto LAB_0013798b;
          }
          piVar6 = item_array<mpt::layout::graph>::append
                             ((item_array<mpt::layout::graph> *)&local_60,this_01,id,-1);
          iVar4 = 0;
          if (piVar6 == (item<mpt::layout::graph> *)0x0) {
            (*(this_01->super_item_group).super_metatype.super_convertable._vptr_convertable[1])
                      (this_01);
            iVar4 = 1;
            if (pcVar9 != (this->super_item_group)._items.
                          super_unique_array<mpt::item<mpt::metatype>_>._ref._ref) {
              if (pcVar9 == (content<mpt::item<mpt::metatype>_> *)0x0) {
                pcVar8 = (content<mpt::item<mpt::metatype>_> *)0x0;
              }
              else {
                iVar5 = (*(pcVar9->super_buffer)._vptr_buffer[2])();
                pcVar8 = (content<mpt::item<mpt::metatype>_> *)CONCAT44(extraout_var_01,iVar5);
                if ((content<mpt::item<mpt::metatype>_> *)CONCAT44(extraout_var_01,iVar5) !=
                    (content<mpt::item<mpt::metatype>_> *)0x0) {
                  pcVar8 = pcVar9;
                }
              }
              pcVar1 = (this->super_item_group)._items.super_unique_array<mpt::item<mpt::metatype>_>
                       ._ref._ref;
              if (pcVar1 != (content<mpt::item<mpt::metatype>_> *)0x0) {
                (*(pcVar1->super_buffer)._vptr_buffer[1])();
              }
              (this->super_item_group)._items.super_unique_array<mpt::item<mpt::metatype>_>._ref.
              _ref = pcVar8;
            }
          }
        }
LAB_0013798b:
        if ((iVar4 != 3) && (iVar4 != 0)) {
          iVar4 = 0;
          goto LAB_001379f4;
        }
        pcVar10 = pcVar10 + 1;
        pcVar8 = local_58;
      } while (pcVar10 != local_58);
    }
    uVar11._ref._ref = local_60._ref._ref;
    iVar4 = 1;
    if (local_60._ref._ref !=
        (reference<mpt::content<mpt::item<mpt::layout::graph>_>_>)
        (this->_graphs).super_unique_array<mpt::item<mpt::layout::graph>_>._ref._ref) {
      if (local_60._ref._ref == (content<mpt::item<mpt::layout::graph>_> *)0x0) {
        uVar11._ref._ref =
             (reference<mpt::content<mpt::item<mpt::layout::graph>_>_>)
             (content<mpt::item<mpt::layout::graph>_> *)0x0;
      }
      else {
        lVar7 = (**(code **)(*(long *)local_60._ref._ref + 0x10))(local_60._ref._ref);
        if (lVar7 == 0) {
          uVar11._ref._ref =
               (reference<mpt::content<mpt::item<mpt::layout::graph>_>_>)
               (content<mpt::item<mpt::layout::graph>_> *)0x0;
        }
      }
      pcVar2 = (this->_graphs).super_unique_array<mpt::item<mpt::layout::graph>_>._ref._ref;
      if (pcVar2 != (content<mpt::item<mpt::layout::graph>_> *)0x0) {
        (*(pcVar2->super_buffer)._vptr_buffer[1])();
      }
      (this->_graphs).super_unique_array<mpt::item<mpt::layout::graph>_>._ref._ref =
           (content<mpt::item<mpt::layout::graph>_> *)uVar11._ref._ref;
    }
LAB_001379f4:
    if (local_60._ref._ref != (content<mpt::item<mpt::layout::graph>_> *)0x0) {
      (**(code **)(*(long *)local_60._ref._ref + 8))();
    }
  }
  if (pcVar9 != (content<mpt::item<mpt::metatype>_> *)0x0) {
    (*(pcVar9->super_buffer)._vptr_buffer[1])(pcVar9);
  }
  return iVar4;
}

Assistant:

int layout::bind(const relation *rel, logger *out)
{
	item_array<metatype> old = _items;
	int ret = 0;
	
	if (!rel) {
		collection::relation me(*this);
		ret = item_group::bind(&me, out);
	} else {
		ret = item_group::bind(rel, out);
	}
	if (ret < 0) {
		return ret;
	}
	item_array<graph> arr;
	
	for (auto &it : _items) {
		metatype *mt;
		graph *g;
		if (!(mt = it.instance()) || !(g = *mt)) {
			continue;
		}
		const char *name = it.name();
		if (!g->addref()) {
			static const char _func[] = "mpt::layout::bind\0";
			::mpt::graph *d;
			object *o = 0;
			if (!(d = *mt) || !(o = *mt)) {
				const char *msg = MPT_tr("unable to get graph information");
				if (out) {
					if (!name || !*name) {
						out->message(_func, out->Warning, "%s", msg);
					} else {
						out->message(_func, out->Warning, "%s: %s", msg, name);
					}
				}
				continue;
			}
			g = new graph(d);
			
			if (o && !g->set(*o, out)) {
				g->unref();
				continue;
			}
		}
		if (!arr.append(g, name)) {
			g->unref();
			_items = old;
			return false;
		}
	}
	_graphs = arr;
	return true;
}